

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGenerator.h
# Opt level: O3

void generateHeapOrder(int size,int heapNumber,vector<int,_std::allocator<int>_> *order)

{
  unsigned_long __res;
  result_type rVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  mt19937 generator;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  std::vector<int,_std::allocator<int>_>::resize(order,(long)size);
  local_13b8._M_x[0] = time((time_t *)0x0);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffff;
  lVar2 = 1;
  uVar3 = local_13b8._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  if (0 < size) {
    uVar4 = (ulong)heapNumber;
    uVar3 = 0;
    do {
      rVar1 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(&local_13b8);
      (order->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = (int)((rVar1 % uVar4 + uVar4) % uVar4);
      uVar3 = uVar3 + 1;
    } while ((uint)size != uVar3);
  }
  return;
}

Assistant:

void generateHeapOrder(int size, int heapNumber, std::vector<int>& order) {
    order.resize(size);
    std::mt19937 generator(time(0));

    for (int i = 0; i < size; i++)
        order[i] = (generator() % heapNumber + heapNumber) % heapNumber;
}